

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O0

int __thiscall MeCab::ContextID::rid(ContextID *this,char *r)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  char *in_RSI;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffff38;
  die local_59;
  _Self local_58 [3];
  allocator local_39;
  string local_38 [32];
  _Self local_18;
  char *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x165947);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator!=(&local_18,local_58);
  if (!bVar1) {
    die::die(&local_59);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x67);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"it != right_.end()");
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"cannot find RIGHT-ID  for ");
    poVar2 = std::operator<<(poVar2,local_10);
    die::operator&(&local_59,poVar2);
    die::~die((die *)0x165a9e);
  }
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                         *)0x165aab);
  return ppVar3->second;
}

Assistant:

int ContextID::rid(const char *r) const {
  std::map<std::string, int>::const_iterator it = right_.find(r);
  CHECK_DIE(it != right_.end())
      << "cannot find RIGHT-ID  for " << r;
  return it->second;
}